

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall UI::renderChannel(UI *this,Channel *channel,int width,bool selected)

{
  ImVec4 *col;
  bool bVar1;
  undefined3 in_register_00000009;
  uint count;
  bool bVar2;
  ImVec2 p0;
  ImVec2 local_48;
  float local_3c;
  ImVec2 local_38;
  
  ImGui::PushID((channel->label)._M_dataplus._M_p);
  local_48 = ImGui::GetCursorScreenPos();
  bVar2 = CONCAT31(in_register_00000009,selected) != 0;
  if (bVar2) {
    ImGui::PushStyleColor(0x15,&(this->colors).channelSelectedBG);
  }
  count = (uint)bVar2;
  local_3c = (float)width;
  local_38.y = 1.0;
  local_38.x = local_3c;
  bVar2 = ImGui::Button("##but",&local_38);
  if (0 < channel->mentions) {
    local_38.x = local_3c + local_48.x + -6.0;
    local_38.y = local_48.y;
    ImGui::SetCursorScreenPos(&local_38);
    ImGui::PushStyleColor(0,&(this->colors).channelMentionsFG);
    col = &(this->colors).channelMentionsBG;
    ImGui::PushStyleColor(0x15,col);
    ImGui::PushStyleColor(0x16,col);
    ImGui::PushStyleColor(0x17,col);
    sprintf(renderChannel::buf," %d ",(ulong)(uint)channel->mentions);
    ImGui::SmallButton(renderChannel::buf);
    ImGui::PopStyleColor(4);
  }
  bVar1 = ImGui::IsItemHovered(0);
  if (((bVar1 || selected) || (channel->hasUnread != false)) || (0 < channel->mentions)) {
    ImGui::PushStyleColor(0,&(this->colors).channelActiveFG);
    count = count + 1;
  }
  ImGui::SetCursorScreenPos(&local_48);
  ImGui::Text("# %s",(channel->label)._M_dataplus._M_p);
  ImGui::PopStyleColor(count);
  ImGui::PopID();
  return bVar2;
}

Assistant:

bool UI::renderChannel(const Channel & channel, int width, bool selected) {
    int npop = 0;
    bool result = false;

    ImGui::PushID(channel.label.c_str());
    const auto p0 = ImGui::GetCursorScreenPos();
    if (selected) {
        ImGui::PushStyleColor(ImGuiCol_Button, colors.channelSelectedBG);
        ++npop;
    }
    if (ImGui::Button("##but", ImVec2(width, 1))) {
        result = true;
    }
    if (channel.mentions > 0) {
        ImGui::SetCursorScreenPos({ p0.x + width - 6, p0.y });
        ImGui::PushStyleColor(ImGuiCol_Text,          colors.channelMentionsFG);
        ImGui::PushStyleColor(ImGuiCol_Button,        colors.channelMentionsBG);
        ImGui::PushStyleColor(ImGuiCol_ButtonHovered, colors.channelMentionsBG);
        ImGui::PushStyleColor(ImGuiCol_ButtonActive,  colors.channelMentionsBG);
        static char buf[16];
        sprintf(buf, " %d ", channel.mentions);
        ImGui::SmallButton(buf);
        ImGui::PopStyleColor(4);
    }
    if (ImGui::IsItemHovered() || selected || channel.hasUnread || channel.mentions > 0) {
        ImGui::PushStyleColor(ImGuiCol_Text, colors.channelActiveFG);
        ++npop;
    }
    ImGui::SetCursorScreenPos(p0);
    ImGui::Text("# %s", channel.label.c_str());
    ImGui::PopStyleColor(npop);
    ImGui::PopID();

    return result;
}